

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O2

void BamTools::Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
               OptionGroup *group,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue)

{
  mapped_type *this;
  Option o;
  Variant VStack_128;
  undefined1 local_120 [16];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined2 local_f0;
  bool local_ee;
  Variant local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  Variant local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0._8_8_ = 0;
  local_a0[0x10] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_1_ = true;
  local_40._1_1_ = false;
  local_38.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_a0);
  std::__cxx11::string::_M_assign((string *)&local_80);
  std::__cxx11::string::_M_assign((string *)&local_60);
  std::__cxx11::string::string((string *)&local_c0,(string *)defaultValue);
  Variant::Variant<std::__cxx11::string>((Variant *)local_120,&local_c0);
  Variant::operator=(&local_38,(Variant *)local_120);
  Variant::~Variant((Variant *)local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  local_40._1_1_ = true;
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_a0);
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._0_1_ = false;
  local_f0._1_1_ = true;
  local_ee = false;
  local_e8.data = (ImplBase *)0x0;
  local_120._0_8_ = foundArgument;
  local_120._8_8_ = val;
  std::__cxx11::string::string((string *)&local_e0,(string *)val);
  Variant::Variant<std::__cxx11::string>(&VStack_128,&local_e0);
  Variant::operator=(&local_e8,&VStack_128);
  Variant::~Variant(&VStack_128);
  std::__cxx11::string::~string((string *)&local_e0);
  local_ee = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_110);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
         ::operator[](&m_optionsMap_abi_cxx11_,argument);
  OptionValue::operator=(this,(OptionValue *)local_120);
  OptionValue::~OptionValue((OptionValue *)local_120);
  Option::~Option((Option *)local_a0);
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group, D& defaultValue)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    o.DefaultValue = defaultValue;
    o.HasDefaultValue = true;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}